

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_string(void)

{
  char *pcVar1;
  char cVar2;
  XSValue *this;
  char *pcVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  Status myStatus;
  StrX local_50;
  char v_1 [9];
  int iVar7;
  
  builtin_strncpy(v_1,"mystring",9);
  myStatus = st_Init;
  StrX::StrX(&local_50,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_50.fUnicodeForm,dt_string,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_50);
  if (cVar2 == '\0') {
    StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x132e,v_1,local_50.fLocalForm,1);
    StrX::~StrX(&local_50);
    errSeen = 1;
  }
  iVar7 = 2;
  while (iVar6 = iVar7 + -1, iVar7 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_50,v_1);
    this = (XSValue *)
           xercesc_4_0::XSValue::getActualValue
                     (local_50.fUnicodeForm,dt_string,&myStatus,ver_10,iVar7 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_50);
    iVar7 = iVar6;
    if (this == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
        pcVar1 = local_50.fLocalForm;
        pcVar3 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x134a,v_1,pcVar1,"st_NoActVal",pcVar3);
        StrX::~StrX(&local_50);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
      pvVar5 = (void *)0x134a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x134a,v_1);
      StrX::~StrX(&local_50);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(this);
      xercesc_4_0::XMemory::operator_delete((XMemory *)this,pvVar5);
    }
  }
  iVar7 = 2;
LAB_001285ee:
  iVar6 = iVar7 + -1;
  if (iVar7 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_50,v_1);
  lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_50.fUnicodeForm,dt_string,&myStatus,ver_10,iVar7 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_50);
  iVar7 = iVar6;
  if (lVar4 == 0) goto LAB_0012867a;
  StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x1368,v_1);
  StrX::~StrX(&local_50);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
  goto LAB_001286c9;
LAB_0012867a:
  if (myStatus != st_NoCanRep) {
    StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
    pcVar1 = local_50.fLocalForm;
    pcVar3 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x1368,v_1,pcVar1,"st_NoCanRep",pcVar3);
    StrX::~StrX(&local_50);
LAB_001286c9:
    errSeen = 1;
  }
  goto LAB_001285ee;
}

Assistant:

void test_dt_string()
{
    const XSValue::DataType dt = XSValue::dt_string;
    bool  toValidate = true;

    const char v_1[]="mystring";
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                     n/a             false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             n/a
     *   invalid                      n/a                  0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             n/a
     *   invalid                      n/a                  0             st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);

        //  invalid
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              n/a
     *   invalid                       n/a                0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              n/a
     *   invalid                       n/a                0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid

    }

}